

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_page_merge(MDB_cursor *csrc,MDB_cursor *cdst)

{
  long *plVar1;
  indx_t *piVar2;
  ushort uVar3;
  unsigned_short uVar4;
  uint16_t uVar5;
  MDB_page *pMVar6;
  MDB_ID id;
  MDB_txn *pMVar7;
  MDB_ID2L ids;
  MDB_xcursor *pMVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  MDB_xcursor *pMVar12;
  short sVar13;
  uint uVar14;
  MDB_xcursor *pMVar15;
  int in_R8D;
  MDB_page *pMVar16;
  uint6 *puVar17;
  ushort uVar18;
  MDB_val data;
  MDB_cursor mn;
  MDB_val local_1f0;
  MDB_ID2L local_1e0;
  MDB_page *local_1d8;
  MDB_cursor *local_1d0;
  MDB_val local_1c8;
  MDB_cursor local_1b8;
  
  if (csrc->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"csrc->mc_snum > 1","mdb_page_merge",(char *)0x21e6,in_R8D)
    ;
  }
  if (cdst->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"cdst->mc_snum > 1","mdb_page_merge",(char *)0x21e7,in_R8D)
    ;
  }
  pMVar6 = csrc->mc_pg[csrc->mc_top];
  iVar9 = mdb_page_touch(cdst);
  if (iVar9 != 0) {
    return iVar9;
  }
  local_1d8 = cdst->mc_pg[cdst->mc_top];
  sVar13 = (short)((local_1d8->mp_pb).pb.pb_lower + 0x1fff0 >> 1);
  if ((pMVar6->mp_flags & 0x20) == 0) {
    if (((pMVar6->mp_pb).pb.pb_lower & 0xfffe) != 0x10) {
      uVar18 = 0;
      local_1d0 = cdst;
      do {
        puVar17 = (uint6 *)((long)pMVar6->mp_ptrs + ((ulong)pMVar6->mp_ptrs[uVar18] - 0x10));
        if ((uVar18 == 0) && ((pMVar6->mp_flags & 1) != 0)) {
          mdb_cursor_copy(csrc,&local_1b8);
          local_1b8.mc_xcursor = (MDB_xcursor *)0x0;
          iVar9 = mdb_page_search_lowest(&local_1b8);
          if (iVar9 != 0) {
            return iVar9;
          }
          pMVar16 = local_1b8.mc_pg[local_1b8.mc_top];
          if ((pMVar16->mp_flags & 0x20) == 0) {
            local_1f0.mv_data = (void *)((long)pMVar16->mp_ptrs + ((ulong)pMVar16->mp_ptrs[0] - 8));
            local_1f0.mv_size =
                 (size_t)*(ushort *)((long)pMVar16->mp_ptrs + ((ulong)pMVar16->mp_ptrs[0] - 10));
          }
          else {
            local_1f0.mv_size = (size_t)(local_1b8.mc_db)->md_pad;
            local_1f0.mv_data = pMVar16->mp_ptrs;
          }
          uVar11 = (ulong)*(ushort *)((long)puVar17 + 6);
          cdst = local_1d0;
        }
        else {
          uVar11 = (ulong)*(ushort *)((long)puVar17 + 6);
          local_1f0.mv_data = puVar17 + 1;
          local_1f0.mv_size = uVar11;
        }
        local_1c8.mv_size = (size_t)(uint)*puVar17;
        local_1c8.mv_data = (void *)((long)puVar17 + uVar11 + 8);
        iVar9 = mdb_node_add(cdst,uVar18 + sVar13,&local_1f0,&local_1c8,(ulong)*puVar17,
                             (uint)*(ushort *)((long)puVar17 + 4));
        if (iVar9 != 0) {
          return iVar9;
        }
        uVar18 = uVar18 + 1;
      } while ((uint)uVar18 < (pMVar6->mp_pb).pb.pb_lower - 0x10 >> 1);
    }
  }
  else {
    local_1f0.mv_size = (size_t)csrc->mc_db->md_pad;
    local_1f0.mv_data = pMVar6->mp_ptrs;
    if (((pMVar6->mp_pb).pb.pb_lower & 0xfffe) != 0x10) {
      uVar18 = 1;
      do {
        iVar9 = mdb_node_add(cdst,sVar13 + -1 + uVar18,&local_1f0,(MDB_val *)0x0,0,0);
        if (iVar9 != 0) {
          return iVar9;
        }
        local_1f0.mv_data = (void *)((long)local_1f0.mv_data + local_1f0.mv_size);
        uVar10 = (uint)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar10 < (pMVar6->mp_pb).pb.pb_lower - 0x10 >> 1);
    }
  }
  csrc->mc_top = csrc->mc_top - 1;
  mdb_node_del(csrc,0);
  uVar18 = csrc->mc_top;
  if (csrc->mc_ki[uVar18] == 0) {
    local_1f0.mv_size = 0;
    iVar9 = mdb_update_key(csrc,&local_1f0);
    uVar18 = csrc->mc_top;
    if (iVar9 != 0) {
      csrc->mc_top = uVar18 + 1;
      return iVar9;
    }
  }
  csrc->mc_top = uVar18 + 1;
  pMVar6 = csrc->mc_pg[(ushort)(uVar18 + 1)];
  id = (pMVar6->mp_p).p_pgno;
  pMVar7 = csrc->mc_txn;
  uVar18 = pMVar6->mp_flags;
  if (((uVar18 & 0x10) != 0) && (csrc->mc_dbi != 0)) {
    if (pMVar7->mt_parent == (MDB_txn *)0x0) {
LAB_0010dabd:
      pMVar6[2].mp_p = (anon_union_8_2_b62042e6_for_mp_p)pMVar7->mt_loose_pgs;
      pMVar7->mt_loose_pgs = pMVar6;
      pMVar7->mt_loose_count = pMVar7->mt_loose_count + 1;
      uVar10 = uVar18 | 0x4000;
      pMVar6->mp_flags = (uint16_t)uVar10;
      goto LAB_0010dad7;
    }
    ids = (pMVar7->mt_u).dirty_list;
    if (ids->mid != 0) {
      local_1e0 = ids;
      uVar10 = mdb_mid2l_search(ids,id);
      uVar11 = (ulong)uVar10;
      if ((uVar11 <= local_1e0->mid) && (local_1e0[uVar11].mid == id)) {
        if ((MDB_page *)local_1e0[uVar11].mptr != pMVar6) {
          *(byte *)&csrc->mc_flags = (byte)csrc->mc_flags & 0xfc;
          *(byte *)&pMVar7->mt_flags = (byte)pMVar7->mt_flags | 2;
          return -0x784c;
        }
        uVar18 = pMVar6->mp_flags;
        goto LAB_0010dabd;
      }
    }
  }
  iVar9 = mdb_midl_append(&pMVar7->mt_free_pgs,id);
  if (iVar9 != 0) {
    return iVar9;
  }
  uVar10 = (uint)pMVar6->mp_flags;
LAB_0010dad7:
  plVar1 = (long *)((long)&csrc->mc_db->md_branch_pages + (ulong)(uVar10 & 2) * 4);
  *plVar1 = *plVar1 + -1;
  pMVar12 = (MDB_xcursor *)csrc->mc_txn->mt_cursors[csrc->mc_dbi];
  if (pMVar12 != (MDB_xcursor *)0x0) {
    uVar18 = csrc->mc_top;
    uVar10 = csrc->mc_flags;
    uVar14 = uVar18 - 1;
    do {
      pMVar15 = pMVar12;
      if ((uVar10 & 4) != 0) {
        pMVar15 = (pMVar12->mx_cursor).mc_xcursor;
      }
      if ((pMVar15 != (MDB_xcursor *)csrc) && (csrc->mc_snum <= (pMVar15->mx_cursor).mc_snum)) {
        pMVar16 = (pMVar15->mx_cursor).mc_pg[uVar18];
        if (pMVar16 == pMVar6) {
          (pMVar15->mx_cursor).mc_pg[uVar18] = local_1d8;
          piVar2 = (pMVar15->mx_cursor).mc_ki + uVar18;
          *piVar2 = *piVar2 + sVar13;
          (pMVar15->mx_cursor).mc_ki[uVar14] = cdst->mc_ki[uVar14];
          pMVar16 = local_1d8;
        }
        else if (((pMVar15->mx_cursor).mc_pg[uVar14] == csrc->mc_pg[uVar14]) &&
                (uVar3 = (pMVar15->mx_cursor).mc_ki[uVar14], csrc->mc_ki[uVar14] < uVar3)) {
          (pMVar15->mx_cursor).mc_ki[uVar14] = uVar3 - 1;
        }
        pMVar8 = (pMVar15->mx_cursor).mc_xcursor;
        if ((((pMVar8 != (MDB_xcursor *)0x0) && (((pMVar8->mx_cursor).mc_flags & 1) != 0)) &&
            ((pMVar6->mp_flags & 2) != 0)) &&
           (uVar11 = (ulong)pMVar16->mp_ptrs[(pMVar15->mx_cursor).mc_ki[uVar18]],
           (*(ushort *)((long)pMVar16->mp_ptrs + (uVar11 - 0xc)) & 6) == 4)) {
          (pMVar8->mx_cursor).mc_pg[0] =
               (MDB_page *)
               ((long)pMVar16->mp_ptrs +
               *(ushort *)((long)pMVar16->mp_ptrs + (uVar11 - 10)) + uVar11 + -8);
        }
      }
      pMVar12 = (MDB_xcursor *)(pMVar12->mx_cursor).mc_next;
    } while (pMVar12 != (MDB_xcursor *)0x0);
  }
  uVar4 = cdst->mc_snum;
  uVar5 = cdst->mc_db->md_depth;
  if (uVar4 != 0) {
    cdst->mc_snum = uVar4 - 1;
    if ((unsigned_short)(uVar4 - 1) == 0) {
      *(byte *)&cdst->mc_flags = (byte)cdst->mc_flags & 0xfe;
    }
    else {
      cdst->mc_top = cdst->mc_top - 1;
    }
  }
  iVar9 = mdb_rebalance(cdst);
  sVar13 = cdst->mc_db->md_depth - uVar5;
  cdst->mc_snum = sVar13 + uVar4;
  cdst->mc_top = (sVar13 + uVar4) - 1;
  return iVar9;
}

Assistant:

static int
mdb_page_merge(MDB_cursor *csrc, MDB_cursor *cdst)
{
	MDB_page	*psrc, *pdst;
	MDB_node	*srcnode;
	MDB_val		 key, data;
	unsigned	 nkeys;
	int			 rc;
	indx_t		 i, j;

	psrc = csrc->mc_pg[csrc->mc_top];
	pdst = cdst->mc_pg[cdst->mc_top];

	DPRINTF(("merging page %"Y"u into %"Y"u", psrc->mp_pgno, pdst->mp_pgno));

	mdb_cassert(csrc, csrc->mc_snum > 1);	/* can't merge root page */
	mdb_cassert(csrc, cdst->mc_snum > 1);

	/* Mark dst as dirty. */
	if ((rc = mdb_page_touch(cdst)))
		return rc;

	/* get dst page again now that we've touched it. */
	pdst = cdst->mc_pg[cdst->mc_top];

	/* Move all nodes from src to dst.
	 */
	j = nkeys = NUMKEYS(pdst);
	if (IS_LEAF2(psrc)) {
		key.mv_size = csrc->mc_db->md_pad;
		key.mv_data = METADATA(psrc);
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			rc = mdb_node_add(cdst, j, &key, NULL, 0, 0);
			if (rc != MDB_SUCCESS)
				return rc;
			key.mv_data = (char *)key.mv_data + key.mv_size;
		}
	} else {
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			srcnode = NODEPTR(psrc, i);
			if (i == 0 && IS_BRANCH(psrc)) {
				MDB_cursor mn;
				MDB_node *s2;
				mdb_cursor_copy(csrc, &mn);
				mn.mc_xcursor = NULL;
				/* must find the lowest key below src */
				rc = mdb_page_search_lowest(&mn);
				if (rc)
					return rc;
				if (IS_LEAF2(mn.mc_pg[mn.mc_top])) {
					key.mv_size = mn.mc_db->md_pad;
					key.mv_data = LEAF2KEY(mn.mc_pg[mn.mc_top], 0, key.mv_size);
				} else {
					s2 = NODEPTR(mn.mc_pg[mn.mc_top], 0);
					key.mv_size = NODEKSZ(s2);
					key.mv_data = NODEKEY(s2);
				}
			} else {
				key.mv_size = srcnode->mn_ksize;
				key.mv_data = NODEKEY(srcnode);
			}

			data.mv_size = NODEDSZ(srcnode);
			data.mv_data = NODEDATA(srcnode);
			rc = mdb_node_add(cdst, j, &key, &data, NODEPGNO(srcnode), srcnode->mn_flags);
			if (rc != MDB_SUCCESS)
				return rc;
		}
	}

	DPRINTF(("dst page %"Y"u now has %u keys (%.1f%% filled)",
	    pdst->mp_pgno, NUMKEYS(pdst),
		(float)PAGEFILL(cdst->mc_txn->mt_env, pdst) / 10));

	/* Unlink the src page from parent and add to free list.
	 */
	csrc->mc_top--;
	mdb_node_del(csrc, 0);
	if (csrc->mc_ki[csrc->mc_top] == 0) {
		key.mv_size = 0;
		rc = mdb_update_key(csrc, &key);
		if (rc) {
			csrc->mc_top++;
			return rc;
		}
	}
	csrc->mc_top++;

	psrc = csrc->mc_pg[csrc->mc_top];
	/* If not operating on FreeDB, allow this page to be reused
	 * in this txn. Otherwise just add to free list.
	 */
	rc = mdb_page_loose(csrc, psrc);
	if (rc)
		return rc;
	if (IS_LEAF(psrc))
		csrc->mc_db->md_leaf_pages--;
	else
		csrc->mc_db->md_branch_pages--;
	{
		/* Adjust other cursors pointing to mp */
		MDB_cursor *m2, *m3;
		MDB_dbi dbi = csrc->mc_dbi;
		unsigned int top = csrc->mc_top;

		for (m2 = csrc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
			if (csrc->mc_flags & C_SUB)
				m3 = &m2->mc_xcursor->mx_cursor;
			else
				m3 = m2;
			if (m3 == csrc) continue;
			if (m3->mc_snum < csrc->mc_snum) continue;
			if (m3->mc_pg[top] == psrc) {
				m3->mc_pg[top] = pdst;
				m3->mc_ki[top] += nkeys;
				m3->mc_ki[top-1] = cdst->mc_ki[top-1];
			} else if (m3->mc_pg[top-1] == csrc->mc_pg[top-1] &&
				m3->mc_ki[top-1] > csrc->mc_ki[top-1]) {
				m3->mc_ki[top-1]--;
			}
			if (m3->mc_xcursor && (m3->mc_xcursor->mx_cursor.mc_flags & C_INITIALIZED) &&
				IS_LEAF(psrc)) {
				MDB_node *node = NODEPTR(m3->mc_pg[top], m3->mc_ki[top]);
				if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) == F_DUPDATA)
					m3->mc_xcursor->mx_cursor.mc_pg[0] = NODEDATA(node);
			}
		}
	}
	{
		unsigned int snum = cdst->mc_snum;
		uint16_t depth = cdst->mc_db->md_depth;
		mdb_cursor_pop(cdst);
		rc = mdb_rebalance(cdst);
		/* Did the tree height change? */
		if (depth != cdst->mc_db->md_depth)
			snum += cdst->mc_db->md_depth - depth;
		cdst->mc_snum = snum;
		cdst->mc_top = snum-1;
	}
	return rc;
}